

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memset.c
# Opt level: O0

void * memset(void *__s,int __c,size_t __n)

{
  undefined1 *local_28;
  uchar *p;
  size_t n_local;
  int c_local;
  void *s_local;
  
  local_28 = (undefined1 *)__s;
  p = (uchar *)__n;
  while (p != (uchar *)0x0) {
    *local_28 = (char)__c;
    local_28 = local_28 + 1;
    p = p + -1;
  }
  return __s;
}

Assistant:

void * memset( void * s, int c, size_t n )
{
    unsigned char * p = ( unsigned char * ) s;

    while ( n-- )
    {
        *p++ = ( unsigned char ) c;
    }

    return s;
}